

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O0

JsErrorCode JsCopyString(JsValueRef value,char *buffer,size_t bufferSize,size_t *length)

{
  size_t sVar1;
  undefined1 local_68 [8];
  WideToNarrow utf8Str;
  size_t sStack_40;
  JsErrorCode errorCode;
  size_t strLength;
  char16 *str;
  size_t *length_local;
  size_t bufferSize_local;
  char *buffer_local;
  JsValueRef value_local;
  
  if (value == (JsValueRef)0x0) {
    value_local._4_4_ = JsErrorNullArgument;
  }
  else if (value == (JsValueRef)0x0) {
    value_local._4_4_ = JsErrorInvalidArgument;
  }
  else {
    strLength = 0;
    sStack_40 = 0;
    str = (char16 *)length;
    length_local = (size_t *)bufferSize;
    bufferSize_local = (size_t)buffer;
    buffer_local = (char *)value;
    utf8Str._28_4_ = JsStringToPointer(value,(WCHAR **)&strLength,&stack0xffffffffffffffc0);
    value_local._4_4_ = utf8Str._28_4_;
    if (utf8Str._28_4_ == JsNoError) {
      utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>::
      NarrowWideConverter((NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>
                           *)local_68,(char16_t **)&strLength,sStack_40,(char *)bufferSize_local,
                          (size_t)length_local);
      if (str != (char16 *)0x0) {
        sVar1 = utf8::
                NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>
                ::Length((NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>
                          *)local_68);
        *(size_t *)str = sVar1;
      }
      value_local._4_4_ = JsNoError;
      utf8::NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>::
      ~NarrowWideConverter
                ((NarrowWideConverter<utf8::malloc_allocator,_const_char16_t_*,_char_*,_unsigned_long>
                  *)local_68);
    }
  }
  return value_local._4_4_;
}

Assistant:

CHAKRA_API JsCopyString(
    _In_ JsValueRef value,
    _Out_opt_ char* buffer,
    _In_ size_t bufferSize,
    _Out_opt_ size_t* length)
{
    PARAM_NOT_NULL(value);
    VALIDATE_JSREF(value);

    const char16* str = nullptr;
    size_t strLength = 0;
    JsErrorCode errorCode = JsStringToPointer(value, &str, &strLength);
    if (errorCode != JsNoError)
    {
        return errorCode;
    }

    utf8::WideToNarrow utf8Str(str, strLength, buffer, bufferSize);
    if (length)
    {
        *length = utf8Str.Length();
    }

    return JsNoError;
}